

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter> *this,void *pointer)

{
  HttpOutputStream *this_00;
  char (*params) [6];
  Array<char> AStack_28;
  
  if (pointer != (void *)0x0) {
    if (*(long *)((long)pointer + 8) != 0) {
      this_00 = anon_unknown_36::HttpEntityBodyWriter::getInner((HttpEntityBodyWriter *)pointer);
      if ((this_00->writeInProgress == false) && ((this_00->inBody & 1U) != 0)) {
        str<char_const(&)[6]>((String *)&AStack_28,(kj *)0x41da24,params);
        anon_unknown_36::HttpOutputStream::writeBodyData(this_00,(String *)&AStack_28);
        Array<char>::~Array(&AStack_28);
        anon_unknown_36::HttpEntityBodyWriter::doneWriting((HttpEntityBodyWriter *)pointer);
      }
    }
    anon_unknown_36::HttpEntityBodyWriter::~HttpEntityBodyWriter((HttpEntityBodyWriter *)pointer);
  }
  operator_delete(pointer,0x18);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }